

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.cpp
# Opt level: O0

char * set_mname(MonsterThing *tp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *local_28;
  char *mname;
  int ch;
  MonsterThing *tp_local;
  
  bVar1 = see_monst(tp);
  if ((bVar1) || ((player.flags & 0x4000U) != 0)) {
    if ((player.flags & 0x800U) == 0) {
      local_28 = monsters[tp->type + -0x41].m_name;
    }
    else {
      iVar2 = getMapDisplay((tp->pos).x,(tp->pos).y);
      iVar3 = isupper(iVar2);
      if (iVar3 == 0) {
        mname._4_4_ = rnd(0x1a);
      }
      else {
        mname._4_4_ = iVar2 + -0x41;
      }
      local_28 = monsters[mname._4_4_].m_name;
    }
    strcpy(set_mname::tbuf + 4,local_28);
    tp_local = (MonsterThing *)set_mname::tbuf;
  }
  else {
    tp_local = (MonsterThing *)0x164adb;
    if ((terse & 1U) != 0) {
      tp_local = (MonsterThing *)0x163e58;
    }
  }
  return (char *)tp_local;
}

Assistant:

const char* set_mname(MonsterThing *tp)
{
    int ch;
    const char *mname;
    static char tbuf[MAXSTR] = { 't', 'h', 'e', ' ' };

    if (!see_monst(tp) && !on(player, SEEMONST))
        return (terse ? "it" : "something");
    else if (on(player, ISHALU))
    {
        ch = getMapDisplay(tp->pos.x, tp->pos.y);
        if (!isupper(ch))
            ch = rnd(26);
        else
            ch -= 'A';
        mname = monsters[ch].m_name;
    }
    else
        mname = monsters[tp->type - 'A'].m_name;
    strcpy(&tbuf[4], mname);
    return tbuf;
}